

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyexr.h
# Opt level: O3

bool tinyexr::ReadAttribute
               (string *name,string *type,
               vector<unsigned_char,_std::allocator<unsigned_char>_> *data,size_t *marker_size,
               char *marker,size_t size)

{
  char cVar1;
  pointer __dest;
  bool bVar2;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this;
  size_t *psVar3;
  int iVar4;
  size_t sVar5;
  size_t sVar6;
  uint *puVar7;
  undefined8 uVar8;
  ulong uVar9;
  char *pcVar10;
  ulong *puVar11;
  char *pcVar12;
  size_t __maxlen;
  ulong uVar13;
  value_type vStack_f8;
  vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_> *pvStack_c0;
  undefined1 *apuStack_b8 [2];
  undefined1 auStack_a8 [16];
  ulong uStack_98;
  uint *puStack_90;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvStack_88;
  size_t *psStack_80;
  size_t sStack_78;
  code *pcStack_70;
  string *local_68;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_60;
  size_t *local_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  pcStack_70 = (code *)0x1c6939;
  local_68 = type;
  sVar5 = strnlen(marker,size);
  if (sVar5 != size) {
    pcStack_70 = (code *)0x1c696c;
    local_60 = data;
    local_58 = marker_size;
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,marker,marker + sVar5);
    pcStack_70 = (code *)0x1c6977;
    std::__cxx11::string::operator=((string *)name,(string *)local_50);
    if (local_50[0] != local_40) {
      pcStack_70 = (code *)0x1c6984;
      operator_delete(local_50[0]);
    }
    pcVar10 = marker + sVar5 + 1;
    __maxlen = size - (sVar5 + 1);
    pcStack_70 = (code *)0x1c699c;
    sVar6 = strnlen(pcVar10,__maxlen);
    if (sVar6 != __maxlen) {
      pcStack_70 = (code *)0x1c69bf;
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_50,pcVar10,pcVar10 + sVar6);
      pcStack_70 = (code *)0x1c69cb;
      std::__cxx11::string::operator=((string *)local_68,(string *)local_50);
      if (local_50[0] != local_40) {
        pcStack_70 = (code *)0x1c69d8;
        operator_delete(local_50[0]);
      }
      psVar3 = local_58;
      this = local_60;
      uVar13 = __maxlen - (sVar6 + 1);
      if (3 < uVar13) {
        puVar7 = (uint *)(pcVar10 + sVar6 + 1);
        uVar9 = (ulong)*puVar7;
        if (uVar9 == 0) {
          pcStack_70 = (code *)0x1c6a4d;
          iVar4 = std::__cxx11::string::compare((char *)local_68);
          if (iVar4 == 0) {
            *psVar3 = sVar5 + sVar6 + 6;
            pcStack_70 = (code *)0x1c6a7a;
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(this,1);
            *(this->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start = '\0';
            return true;
          }
        }
        else if (uVar9 <= uVar13 - 4) {
          pcStack_70 = (code *)0x1c6a14;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(local_60,uVar9);
          __dest = (this->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                   .super__Vector_impl_data._M_start;
          if ((this->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_finish != __dest) {
            pcStack_70 = (code *)0x1c6a2d;
            memcpy(__dest,pcVar10 + sVar6 + 5,uVar9);
            *psVar3 = uVar9 + sVar5 + sVar6 + 6;
            return true;
          }
          pcVar12 = "vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)";
          puVar11 = (ulong *)0x0;
          pcStack_70 = ReadChannelInfo;
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0
                    );
          psStack_80 = psVar3;
          pvStack_88 = this;
          pcVar10 = (char *)*puVar11;
          pvStack_c0 = (vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_> *)
                       pcVar12;
          uStack_98 = uVar9;
          puStack_90 = puVar7;
          sStack_78 = sVar5;
          pcStack_70 = (code *)sVar6;
          if ((char *)puVar11[1] == pcVar10) {
            uVar8 = std::__throw_out_of_range_fmt
                              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                               ,0,0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)vStack_f8.name._M_dataplus._M_p != &vStack_f8.name.field_2) {
              operator_delete(vStack_f8.name._M_dataplus._M_p);
            }
            _Unwind_Resume(uVar8);
          }
          do {
            vStack_f8.name._M_dataplus._M_p = (pointer)&vStack_f8.name.field_2;
            cVar1 = *pcVar10;
            if (cVar1 == '\0') break;
            vStack_f8.name._M_string_length = 0;
            vStack_f8.name.field_2._M_local_buf[0] = '\0';
            uVar13 = (long)puVar11[1] - (long)pcVar10;
            if ((long)uVar13 < 0) {
LAB_001c6b1f:
              bVar2 = false;
            }
            else {
              if ((char *)puVar11[1] == pcVar10) {
                pcVar10 = (char *)0x0;
                goto LAB_001c6b1f;
              }
              uVar9 = 0;
              pcVar12 = pcVar10;
              do {
                if (*pcVar12 == '\0') {
                  apuStack_b8[0] = auStack_a8;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)apuStack_b8,pcVar10,pcVar12);
                  std::__cxx11::string::operator=((string *)&vStack_f8,(string *)apuStack_b8);
                  if (apuStack_b8[0] != auStack_a8) {
                    operator_delete(apuStack_b8[0]);
                  }
                  pcVar10 = pcVar12 + 0x11;
                  if (pcVar10 < (char *)puVar11[1]) {
                    vStack_f8.pixel_type = *(int *)(pcVar12 + 1);
                    vStack_f8.p_linear = pcVar12[5];
                    vStack_f8.x_sampling = *(int *)(pcVar12 + 9);
                    vStack_f8.y_sampling = *(int *)(pcVar12 + 0xd);
                    bVar2 = true;
                    std::vector<tinyexr::TChannelInfo,_std::allocator<tinyexr::TChannelInfo>_>::
                    push_back(pvStack_c0,&vStack_f8);
                  }
                  else {
                    pcVar10 = pcVar12 + 1;
                    bVar2 = false;
                  }
                  goto LAB_001c6b22;
                }
                pcVar12 = pcVar12 + 1;
                uVar9 = uVar9 + 1;
              } while (uVar9 < uVar13);
              pcVar10 = (char *)0x0;
              bVar2 = false;
            }
LAB_001c6b22:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)vStack_f8.name._M_dataplus._M_p != &vStack_f8.name.field_2) {
              operator_delete(vStack_f8.name._M_dataplus._M_p);
            }
          } while (bVar2);
          return cVar1 == '\0';
        }
      }
    }
  }
  return false;
}

Assistant:

static bool ReadAttribute(std::string *name, std::string *type,
                          std::vector<unsigned char> *data, size_t *marker_size,
                          const char *marker, size_t size) {
  size_t name_len = strnlen(marker, size);
  if (name_len == size) {
    // String does not have a terminating character.
    return false;
  }
  *name = std::string(marker, name_len);

  marker += name_len + 1;
  size -= name_len + 1;

  size_t type_len = strnlen(marker, size);
  if (type_len == size) {
    return false;
  }
  *type = std::string(marker, type_len);

  marker += type_len + 1;
  size -= type_len + 1;

  if (size < sizeof(uint32_t)) {
    return false;
  }

  uint32_t data_len;
  memcpy(&data_len, marker, sizeof(uint32_t));
  tinyexr::swap4(reinterpret_cast<unsigned int *>(&data_len));

  if (data_len == 0) {
    if ((*type).compare("string") == 0) {
      // Accept empty string attribute.

      marker += sizeof(uint32_t);
      size -= sizeof(uint32_t);

      *marker_size = name_len + 1 + type_len + 1 + sizeof(uint32_t);

      data->resize(1);
      (*data)[0] = '\0';

      return true;
    } else {
      return false;
    }
  }

  marker += sizeof(uint32_t);
  size -= sizeof(uint32_t);

  if (size < data_len) {
    return false;
  }

  data->resize(static_cast<size_t>(data_len));
  memcpy(&data->at(0), marker, static_cast<size_t>(data_len));

  *marker_size = name_len + 1 + type_len + 1 + sizeof(uint32_t) + data_len;
  return true;
}